

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

void order_unassigned(sat_solver3 *s,int v)

{
  int iVar1;
  int *piVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if (s->orderpos[v] == -1) {
    s->orderpos[v] = (s->order).size;
    uVar10 = (s->order).cap;
    if ((s->order).size == uVar10) {
      iVar7 = (uVar10 >> 1) * 3;
      if ((int)uVar10 < 4) {
        iVar7 = uVar10 * 2;
      }
      piVar6 = (s->order).ptr;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar7 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar7 << 2);
      }
      (s->order).ptr = piVar6;
      if (piVar6 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->order).cap * 9.5367431640625e-07,(double)iVar7 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->order).cap = iVar7;
    }
    iVar7 = (s->order).size;
    (s->order).size = iVar7 + 1;
    (s->order).ptr[iVar7] = v;
    piVar6 = s->orderpos;
    piVar2 = (s->order).ptr;
    uVar10 = piVar6[v];
    uVar8 = (ulong)(int)uVar10;
    iVar7 = piVar2[uVar8];
    if (uVar8 != 0) {
      if (uVar10 == 0xffffffff) {
        __assert_fail("s->orderpos[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                      ,0x91,"void order_update(sat_solver3 *, int)");
      }
      pwVar3 = s->activity;
      uVar4 = pwVar3[iVar7];
      do {
        uVar5 = (uint)uVar8;
        uVar9 = (int)((uVar5 - ((int)(uVar5 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar2[(int)uVar9];
        uVar10 = uVar5;
        if (uVar4 <= pwVar3[iVar1]) break;
        piVar2[(int)uVar5] = iVar1;
        piVar6[iVar1] = uVar5;
        uVar8 = (ulong)uVar9;
        uVar10 = uVar9;
      } while (2 < uVar5);
    }
    piVar2[(int)uVar10] = iVar7;
    piVar6[iVar7] = uVar10;
  }
  return;
}

Assistant:

static inline void order_unassigned(sat_solver3* s, int v) // undoorder
{
    int* orderpos = s->orderpos;
    if (orderpos[v] == -1){
        orderpos[v] = veci_size(&s->order);
        veci_push(&s->order,v);
        order_update(s,v);
//printf( "+%d ", v );
    }
}